

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOrder.c
# Opt level: O2

void Abc_NtkChangeCiOrder(Abc_Ntk_t *pNtk,Vec_Ptr_t *vSupp,int fReverse)

{
  void *pvVar1;
  int i;
  int iVar2;
  int iVar3;
  
  iVar2 = vSupp->nSize;
  if (iVar2 == pNtk->vCis->nSize) {
    i = 0;
    if (fReverse == 0) {
      for (; i < iVar2; i = i + 1) {
        pvVar1 = Vec_PtrEntry(vSupp,i);
        Vec_PtrWriteEntry(pNtk->vCis,i,pvVar1);
        iVar2 = vSupp->nSize;
      }
    }
    else {
      iVar3 = -1;
      for (; i < iVar2; i = i + 1) {
        pvVar1 = Vec_PtrEntry(vSupp,i);
        Vec_PtrWriteEntry(pNtk->vCis,vSupp->nSize + iVar3,pvVar1);
        iVar2 = vSupp->nSize;
        iVar3 = iVar3 + -1;
      }
    }
    pNtk->vPis->nSize = 0;
    for (iVar2 = 0; iVar2 < pNtk->vCis->nSize; iVar2 = iVar2 + 1) {
      pvVar1 = Vec_PtrEntry(pNtk->vCis,iVar2);
      if ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 2) {
        Vec_PtrPush(pNtk->vPis,pvVar1);
      }
    }
    return;
  }
  __assert_fail("Vec_PtrSize(vSupp) == Abc_NtkCiNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcOrder.c"
                ,0x70,"void Abc_NtkChangeCiOrder(Abc_Ntk_t *, Vec_Ptr_t *, int)");
}

Assistant:

void Abc_NtkChangeCiOrder( Abc_Ntk_t * pNtk, Vec_Ptr_t * vSupp, int fReverse )
{
    Abc_Obj_t * pObj;
    int i;
    assert( Vec_PtrSize(vSupp) == Abc_NtkCiNum(pNtk) );
    // order CIs using the array
    if ( fReverse )
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, i )
            Vec_PtrWriteEntry( pNtk->vCis, Vec_PtrSize(vSupp)-1-i, pObj );
    else
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, i )
            Vec_PtrWriteEntry( pNtk->vCis, i, pObj );
    // order PIs accordingly
    Vec_PtrClear( pNtk->vPis );
    Abc_NtkForEachCi( pNtk, pObj, i )
        if ( Abc_ObjIsPi(pObj) )
            Vec_PtrPush( pNtk->vPis, pObj );
//    Abc_NtkForEachCi( pNtk, pObj, i )
//        printf( "%s ", Abc_ObjName(pObj) );
//    printf( "\n" );
}